

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          StringTree *params_1,ArrayPtr<const_char> *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,ArrayPtr<const_char> *params_9,
          ArrayPtr<const_char> *params_10,ArrayPtr<const_char> *params_11,
          ArrayPtr<const_char> *params_12,ArrayPtr<const_char> *params_13)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  char *__n;
  Branch *pBVar4;
  long lVar5;
  char *pos;
  long lVar6;
  long lVar7;
  size_t elementCount;
  char *local_e0;
  long lStack_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  String local_70;
  StringTree *local_58;
  StringTree *local_50;
  StringTree *local_48;
  ArrayPtr<const_char> *local_40;
  ArrayPtr<const_char> *local_38;
  
  lVar6 = 0;
  lVar7 = 0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  *(undefined1 (*) [16])&(__return_storage_ptr__->text).content.disposer = (undefined1  [16])0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_e0 = (this->text).content.ptr;
  lStack_d8 = (long)params->ptr;
  local_d0._0_8_ = (params_1->text).content.ptr;
  local_d0._8_8_ = params_2->size_;
  local_c0._0_8_ = params_3->size_;
  local_c0._8_8_ = params_4->size_;
  local_b0._0_8_ = params_5->size_;
  local_b0._8_8_ = params_6->size_;
  local_a0._0_8_ = params_7->size_;
  local_a0._8_8_ = params_8->size_;
  local_90._0_8_ = params_9->size_;
  local_90._8_8_ = params_10->size_;
  local_80._0_8_ = params_11->size_;
  local_80._8_8_ = params_12->size_;
  lVar5 = 0;
  do {
    lVar6 = lVar6 + (long)(&local_e0)[lVar5];
    lVar7 = lVar7 + *(long *)(local_d0 + lVar5 * 8 + -8);
    lVar5 = lVar5 + 2;
  } while (lVar5 != 0xe);
  __return_storage_ptr__->size_ = lVar6 + lVar7;
  lStack_d8 = 0;
  lVar6 = 0;
  lVar7 = 0;
  lVar5 = 0;
  do {
    lVar6 = lVar6 + (long)(&local_e0)[lVar5];
    lVar7 = lVar7 + *(long *)(local_d0 + lVar5 * 8 + -8);
    lVar5 = lVar5 + 2;
  } while (lVar5 != 0xe);
  local_58 = this;
  local_50 = (StringTree *)params;
  local_48 = params_1;
  local_40 = params_2;
  local_38 = params_3;
  heapString(&local_70,lVar6 + lVar7);
  (__return_storage_ptr__->text).content.ptr = local_70.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_70.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_70.content.disposer;
  local_e0 = (char *)0x0;
  lStack_d8 = 1;
  lVar6 = 0;
  lVar7 = 0;
  local_d0 = (undefined1  [16])0x0;
  local_c0 = (undefined1  [16])0x0;
  local_b0 = (undefined1  [16])0x0;
  local_a0 = (undefined1  [16])0x0;
  local_90 = (undefined1  [16])0x0;
  local_80 = (undefined1  [16])0x0;
  lVar5 = 0;
  do {
    lVar6 = lVar6 + (long)(&local_e0)[lVar5];
    lVar7 = lVar7 + *(long *)(local_d0 + lVar5 * 8 + -8);
    lVar5 = lVar5 + 2;
  } while (lVar5 != 0xe);
  elementCount = lVar6 + lVar7;
  pBVar4 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,elementCount,elementCount,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  local_70.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_70.content.ptr = (char *)pBVar4;
  local_70.content.size_ = elementCount;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar4;
  (__return_storage_ptr__->branches).size_ = elementCount;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  __n = (local_58->text).content.ptr;
  if (__n != (char *)0x0) {
    memcpy(pos,(void *)local_58->size_,(size_t)__n);
    pos = pos + (long)__n;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,local_50,(ArrayPtr<const_char> *)local_48,local_40,
             local_38,params_4,params_5,params_6,params_7,params_8,params_9,params_10,params_11,
             params_12);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}